

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O2

void __thiscall glslang::TIntermediate::setSourceFile(TIntermediate *this,char *file)

{
  if (file != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->sourceFile);
    return;
  }
  return;
}

Assistant:

void setSourceFile(const char* file) { if (file != nullptr) sourceFile = file; }